

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O1

Vec3fa embree::ReflectiveMetalMaterial__sample
                 (ISPCReflectiveMetalMaterial *This,BRDF *brdf,Vec3fa *Lw,Vec3fa *wo,
                 DifferentialGeometry *dg,Sample3f *wi_o,Medium *medium,Vec2f *s)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar12;
  float fVar10;
  float fVar13;
  undefined1 auVar11 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar23;
  float fVar24;
  undefined1 in_XMM6 [16];
  undefined1 auVar22 [16];
  float fVar25;
  Vec3fa VVar26;
  
  fVar5 = (float)dg->geomID;
  fVar7 = (float)dg->primID;
  fVar2 = dg->u;
  fVar9 = wi_o[2].v.field_0.m128[0];
  fVar4 = wi_o[2].v.field_0.m128[1];
  fVar6 = wi_o[2].v.field_0.m128[2];
  fVar8 = wi_o[2].v.field_0.m128[3];
  fVar15 = fVar7 * fVar6 + fVar5 * fVar4 + (float)dg->instIDs[0] * fVar9;
  fVar15 = fVar15 + fVar15;
  (medium->transmission).field_0.m128[0] = fVar15 * fVar9 - (float)dg->instIDs[0];
  (medium->transmission).field_0.m128[1] = fVar15 * fVar4 - fVar5;
  (medium->transmission).field_0.m128[2] = fVar15 * fVar6 - fVar7;
  (medium->transmission).field_0.m128[3] = fVar15 * fVar8 - fVar2;
  medium->eta = 1.0;
  fVar3 = (float)dg->geomID * wi_o[2].v.field_0.m128[1] +
          (float)dg->instIDs[0] * wi_o[2].v.field_0.m128[0] +
          (float)dg->primID * wi_o[2].v.field_0.m128[2];
  fVar5 = (brdf->Kd).field_0.m128[0];
  fVar7 = (brdf->Kd).field_0.m128[1];
  fVar2 = (brdf->Kd).field_0.m128[2];
  fVar9 = (brdf->Kd).field_0.m128[3];
  fVar4 = (brdf->Ks).field_0.m128[0];
  fVar6 = (brdf->Ks).field_0.m128[1];
  fVar8 = (brdf->Ks).field_0.m128[2];
  fVar15 = (brdf->Ks).field_0.m128[3];
  auVar11._0_4_ = fVar4 * fVar4 + fVar5 * fVar5;
  auVar11._4_4_ = fVar6 * fVar6 + fVar7 * fVar7;
  auVar11._8_4_ = fVar8 * fVar8 + fVar2 * fVar2;
  auVar11._12_4_ = fVar15 * fVar15 + fVar9 * fVar9;
  fVar16 = fVar3 * fVar3;
  fVar4 = fVar3 * (fVar5 + fVar5);
  fVar6 = fVar3 * (fVar7 + fVar7);
  fVar8 = fVar3 * (fVar2 + fVar2);
  fVar3 = fVar3 * (fVar9 + fVar9);
  fVar17 = fVar4 + auVar11._0_4_ * fVar16 + 1.0;
  fVar18 = fVar6 + auVar11._4_4_ * fVar16 + 1.0;
  fVar19 = fVar8 + auVar11._8_4_ * fVar16 + 1.0;
  fVar20 = fVar3 + auVar11._12_4_ * fVar16 + 1.0;
  auVar1._4_4_ = fVar18;
  auVar1._0_4_ = fVar17;
  auVar1._8_4_ = fVar19;
  auVar1._12_4_ = fVar20;
  auVar22 = rcpps(in_XMM6,auVar1);
  fVar21 = auVar22._0_4_;
  fVar23 = auVar22._4_4_;
  fVar24 = auVar22._8_4_;
  fVar25 = auVar22._12_4_;
  fVar5 = fVar4 + auVar11._0_4_ + fVar16;
  fVar7 = fVar6 + auVar11._4_4_ + fVar16;
  fVar9 = fVar8 + auVar11._8_4_ + fVar16;
  fVar15 = fVar3 + auVar11._12_4_ + fVar16;
  auVar22._4_4_ = fVar7;
  auVar22._0_4_ = fVar5;
  auVar22._8_4_ = fVar9;
  auVar22._12_4_ = fVar15;
  auVar22 = rcpps(auVar11,auVar22);
  fVar10 = auVar22._0_4_;
  VVar26.field_0._0_4_ = fVar5 * fVar10;
  fVar12 = auVar22._4_4_;
  VVar26.field_0._4_4_ = fVar7 * fVar12;
  fVar13 = auVar22._8_4_;
  fVar14 = auVar22._12_4_;
  fVar5 = (brdf->Ka).field_0.m128[1];
  fVar7 = (brdf->Ka).field_0.m128[2];
  fVar2 = (brdf->Ka).field_0.m128[3];
  (This->base).type =
       (int)((((1.0 - VVar26.field_0._0_4_) * fVar10 + fVar10) * ((auVar11._0_4_ - fVar4) + fVar16)
             + ((1.0 - fVar17 * fVar21) * fVar21 + fVar21) *
               ((auVar11._0_4_ * fVar16 - fVar4) + 1.0)) * 0.5 * (brdf->Ka).field_0.m128[0]);
  (This->base).align[0] =
       (int)((((1.0 - VVar26.field_0._4_4_) * fVar12 + fVar12) * ((auVar11._4_4_ - fVar6) + fVar16)
             + ((1.0 - fVar18 * fVar23) * fVar23 + fVar23) *
               ((auVar11._4_4_ * fVar16 - fVar6) + 1.0)) * 0.5 * fVar5);
  (This->base).align[1] =
       (int)((((1.0 - fVar9 * fVar13) * fVar13 + fVar13) * ((auVar11._8_4_ - fVar8) + fVar16) +
             ((1.0 - fVar19 * fVar24) * fVar24 + fVar24) * ((auVar11._8_4_ * fVar16 - fVar8) + 1.0))
             * 0.5 * fVar7);
  (This->base).align[2] =
       (int)((((1.0 - fVar15 * fVar14) * fVar14 + fVar14) * ((auVar11._12_4_ - fVar3) + fVar16) +
             ((1.0 - fVar20 * fVar25) * fVar25 + fVar25) * ((auVar11._12_4_ * fVar16 - fVar3) + 1.0)
             ) * 0.5 * fVar2);
  VVar26.field_0._8_8_ = auVar22._0_8_;
  return (Vec3fa)VVar26.field_0;
}

Assistant:

Vec3fa ReflectiveMetalMaterial__sample(ISPCReflectiveMetalMaterial* This, const BRDF& brdf, const Vec3fa& Lw, const Vec3fa& wo, const DifferentialGeometry& dg, Sample3f& wi_o, Medium& medium, const Vec2f& s)
{
  wi_o = make_Sample3f(reflect(wo,dg.Ns),1.0f);
  return Vec3fa(This->reflectance) * fresnelConductor(dot(wo,dg.Ns),Vec3fa((Vec3fa)This->eta),Vec3fa((Vec3fa)This->k));
}